

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

void __thiscall Quest_Context::UsedSpell(Quest_Context *this,short id)

{
  ushort uVar1;
  bool bVar2;
  ushort *puVar3;
  int subject;
  int subject_00;
  uint uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e8;
  string local_c8;
  string local_a8;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  if ((this->quest->quest->info).disabled == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"usedspell",(allocator<char> *)&bStack_e8);
    local_48._8_8_ = 0;
    local_48._2_6_ = 0;
    local_48._0_2_ = id;
    local_30 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1075:44)>
               ::_M_invoke;
    local_38 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1075:44)>
               ::_M_manager;
    bVar2 = EOPlus::Context::QueryRule
                      (&this->super_Context,&local_88,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_48);
    std::_Function_base::~_Function_base((_Function_base *)&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    uVar4 = 0;
    if (bVar2) {
      util::to_string_abi_cxx11_(&local_c8,(util *)(ulong)(uint)(int)id,subject);
      std::operator+(&bStack_e8,"usedspell/",&local_c8);
      puVar3 = (ushort *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&bStack_e8);
      uVar1 = *puVar3;
      *puVar3 = (ushort)(uVar1 + 1);
      std::__cxx11::string::~string((string *)&bStack_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      uVar4 = (uVar1 + 1) * 0x10000;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"usedspell",(allocator<char> *)&bStack_e8);
    local_68._8_8_ = 0;
    local_68._4_4_ = 0;
    local_68._0_4_ = uVar4 | (ushort)id;
    local_50 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1081:37)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:1081:37)>
               ::_M_manager;
    bVar2 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_a8,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_68);
    std::_Function_base::~_Function_base((_Function_base *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    if (bVar2) {
      util::to_string_abi_cxx11_(&local_c8,(util *)(ulong)(uint)(int)id,subject_00);
      std::operator+(&bStack_e8,"usedspell/",&local_c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::erase(&(this->progress)._M_t,&bStack_e8);
      std::__cxx11::string::~string((string *)&bStack_e8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  return;
}

Assistant:

void Quest_Context::UsedSpell(short id)
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("usedspell", [id](const std::deque<util::variant>& args) { return int(args[0]) == id; });
	short amount = 0;

	if (check)
		amount = ++this->progress["usedspell/" + util::to_string(id)];

	if (this->TriggerRule("usedspell", [id, amount](const std::deque<util::variant>& args) { return int(args[0]) == id && amount >= int(args[1]); }))
		this->progress.erase("usedspell/" + util::to_string(id));
}